

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.hpp
# Opt level: O2

string * bitstring<(unsigned_char)3,(unsigned_char)2>
                   (string *__return_storage_ptr__,
                   flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x02_> *ff)

{
  stringstream buffer;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  flexfloat_as_bits(local_190);
  operator<<(local_190,ff);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string bitstring(const flexfloat<e, f> &ff) noexcept
{
    std::stringstream buffer;
    buffer << flexfloat_as_bits << ff;
    return buffer.str();
}